

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O3

boolean read_text_integer(FILE *file,long *result,int *termchar)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  boolean bVar4;
  long lVar5;
  
  bVar4 = 0;
  do {
    iVar1 = text_getc(file);
    if (iVar1 == -1) {
      iVar1 = -1;
      goto LAB_00103b24;
    }
    ppuVar3 = __ctype_b_loc();
  } while (((*ppuVar3)[iVar1] >> 0xd & 1) != 0);
  bVar4 = 0;
  if (((*ppuVar3)[iVar1] >> 0xb & 1) != 0) {
    lVar5 = (long)(iVar1 + -0x30);
    iVar2 = text_getc(file);
    while ((iVar1 = -1, iVar2 != -1 &&
           (iVar1 = iVar2, (*(byte *)((long)*ppuVar3 + (long)iVar2 * 2 + 1) & 8) != 0))) {
      lVar5 = (long)iVar2 + lVar5 * 10 + -0x30;
      iVar2 = text_getc(file);
    }
    *result = lVar5;
    bVar4 = 1;
  }
LAB_00103b24:
  *termchar = iVar1;
  return bVar4;
}

Assistant:

LOCAL(boolean)
read_text_integer(FILE *file, long *result, int *termchar)
/* Read an unsigned decimal integer from a file, store it in result */
/* Reads one trailing character after the integer; returns it in termchar */
{
  register int ch;
  register long val;

  /* Skip any leading whitespace, detect EOF */
  do {
    ch = text_getc(file);
    if (ch == EOF) {
      *termchar = ch;
      return FALSE;
    }
  } while (isspace(ch));

  if (!isdigit(ch)) {
    *termchar = ch;
    return FALSE;
  }

  val = ch - '0';
  while ((ch = text_getc(file)) != EOF) {
    if (!isdigit(ch))
      break;
    val *= 10;
    val += ch - '0';
  }
  *result = val;
  *termchar = ch;
  return TRUE;
}